

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O2

void __thiscall
draco::
StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
::~StatusOr(StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
            *this)

{
  std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
  ~unique_ptr(&this->value_);
  std::__cxx11::string::~string((string *)&(this->status_).error_msg_);
  return;
}

Assistant:

StatusOr() {}